

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_list_fill_triangle(nk_draw_list *list,nk_vec2 a,nk_vec2 b,nk_vec2 c,nk_color col)

{
  if (0xffffff < (uint)col && list != (nk_draw_list *)0x0) {
    nk_draw_list_path_line_to(list,a);
    nk_draw_list_path_line_to(list,b);
    nk_draw_list_path_line_to(list,c);
    nk_draw_list_path_fill(list,col);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_fill_triangle(struct nk_draw_list *list, struct nk_vec2 a,
struct nk_vec2 b, struct nk_vec2 c, struct nk_color col)
{
NK_ASSERT(list);
if (!list || !col.a) return;
nk_draw_list_path_line_to(list, a);
nk_draw_list_path_line_to(list, b);
nk_draw_list_path_line_to(list, c);
nk_draw_list_path_fill(list, col);
}